

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  Ch *pCVar1;
  Ch *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  _func_int **pp_Var5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  BaseState<false> *pBVar9;
  undefined4 extraout_var_00;
  
  is->src_ = is->src_ + 1;
  pBVar9 = (handler->ctx).current_state;
  iVar3 = (*pBVar9->_vptr_BaseState[8])(pBVar9,handler);
  if ((BaseState<false> *)CONCAT44(extraout_var,iVar3) != (BaseState<false> *)0x0) {
    (handler->ctx).previous_state = (handler->ctx).current_state;
    (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var,iVar3);
    pbVar4 = (byte *)is->src_;
    while (((ulong)*pbVar4 < 0x21 && ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
      pbVar4 = pbVar4 + 1;
    }
    is->src_ = (Ch *)pbVar4;
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (*pbVar4 == 0x5d) {
      is->src_ = (Ch *)(pbVar4 + 1);
      pBVar9 = (handler->ctx).current_state;
      pp_Var5 = pBVar9->_vptr_BaseState;
      uVar7 = 0;
    }
    else {
      uVar8 = 0;
      while( true ) {
        ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pbVar4 = (byte *)is->src_;
        pbVar6 = pbVar4;
        while (((ulong)*pbVar4 < 0x21 && ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
          pbVar4 = pbVar4 + 1;
          pbVar6 = pbVar6 + 1;
        }
        is->src_ = (Ch *)pbVar4;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        uVar8 = uVar8 + 1;
        if (*pbVar4 != 0x2c) break;
        pbVar4 = pbVar4 + 1;
        is->src_ = (Ch *)pbVar4;
        while (((ulong)*pbVar4 < 0x21 && ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
          pbVar4 = pbVar4 + 1;
        }
        is->src_ = (Ch *)pbVar4;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
      }
      if (*pbVar4 != 0x5d) {
        pCVar1 = is->head_;
        *(undefined4 *)(this + 0x30) = 7;
        *(long *)(this + 0x38) = (long)pbVar6 - (long)pCVar1;
        return;
      }
      is->src_ = (Ch *)(pbVar4 + 1);
      pBVar9 = (handler->ctx).current_state;
      pp_Var5 = pBVar9->_vptr_BaseState;
      uVar7 = (ulong)uVar8;
    }
    iVar3 = (*pp_Var5[9])(pBVar9,handler,uVar7);
    if ((BaseState<false> *)CONCAT44(extraout_var_00,iVar3) != (BaseState<false> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var_00,iVar3);
      return;
    }
  }
  pCVar1 = is->src_;
  pCVar2 = is->head_;
  *(undefined4 *)(this + 0x30) = 0x10;
  *(long *)(this + 0x38) = (long)pCVar1 - (long)pCVar2;
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }